

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

void pax_time(char *p,int64_t *ps,long *pn)

{
  bool bVar1;
  char cVar2;
  int64_t last_digit_limit;
  int64_t limit;
  ulong uStack_38;
  wchar_t sign;
  unsigned_long l;
  int64_t s;
  char digit;
  long *pn_local;
  int64_t *ps_local;
  char *p_local;
  
  l = 0;
  limit._4_4_ = 1;
  ps_local = (int64_t *)p;
  if (*p == '-') {
    limit._4_4_ = -1;
    ps_local = (int64_t *)(p + 1);
  }
  while( true ) {
    bVar1 = false;
    if ('/' < (char)*ps_local) {
      bVar1 = (char)*ps_local < ':';
    }
    if (!bVar1) goto LAB_001a1e0e;
    cVar2 = (char)*ps_local + -0x30;
    if ((0xccccccccccccccc < (long)l) || ((l == 0xccccccccccccccc && ('\a' < cVar2)))) break;
    l = l * 10 + (long)cVar2;
    ps_local = (int64_t *)((long)ps_local + 1);
  }
  l = 0x7fffffffffffffff;
LAB_001a1e0e:
  *ps = l * (long)limit._4_4_;
  *pn = 0;
  if ((char)*ps_local == '.') {
    uStack_38 = 100000000;
    do {
      ps_local = (int64_t *)((long)ps_local + 1);
      if (*(char *)ps_local < '0') {
        return;
      }
      if ('9' < *(char *)ps_local) {
        return;
      }
      *pn = (long)(*(char *)ps_local + -0x30) * uStack_38 + *pn;
      uStack_38 = uStack_38 / 10;
    } while (uStack_38 != 0);
  }
  return;
}

Assistant:

static void
pax_time(const char *p, int64_t *ps, long *pn)
{
	char digit;
	int64_t	s;
	unsigned long l;
	int sign;
	int64_t limit, last_digit_limit;

	limit = INT64_MAX / 10;
	last_digit_limit = INT64_MAX % 10;

	s = 0;
	sign = 1;
	if (*p == '-') {
		sign = -1;
		p++;
	}
	while (*p >= '0' && *p <= '9') {
		digit = *p - '0';
		if (s > limit ||
		    (s == limit && digit > last_digit_limit)) {
			s = INT64_MAX;
			break;
		}
		s = (s * 10) + digit;
		++p;
	}

	*ps = s * sign;

	/* Calculate nanoseconds. */
	*pn = 0;

	if (*p != '.')
		return;

	l = 100000000UL;
	do {
		++p;
		if (*p >= '0' && *p <= '9')
			*pn += (*p - '0') * l;
		else
			break;
	} while (l /= 10);
}